

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::BestCastFinder::handleRefinement(BestCastFinder *this,Expression *curr)

{
  Module *pMVar1;
  Expression *pEVar2;
  LocalSet *pLVar3;
  LocalGet *pLVar4;
  LocalGet *get;
  Expression *fallthrough;
  LocalSet *tee;
  Expression *teeFallthrough;
  Expression *curr_local;
  BestCastFinder *this_local;
  
  pMVar1 = Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                        *)this);
  pEVar2 = Properties::getFallthrough(curr,&this->options,pMVar1,NoTeeBrIf);
  pLVar3 = Expression::dynCast<wasm::LocalSet>(pEVar2);
  if (pLVar3 != (LocalSet *)0x0) {
    updateBestCast(this,curr,pLVar3->index);
  }
  pMVar1 = Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                        *)this);
  pEVar2 = Properties::getFallthrough(pEVar2,&this->options,pMVar1,AllowTeeBrIf);
  pLVar4 = Expression::dynCast<wasm::LocalGet>(pEVar2);
  if (pLVar4 != (LocalGet *)0x0) {
    updateBestCast(this,curr,pLVar4->index);
  }
  return;
}

Assistant:

void handleRefinement(Expression* curr) {
    auto* teeFallthrough = Properties::getFallthrough(
      curr, options, *getModule(), Properties::FallthroughBehavior::NoTeeBrIf);
    if (auto* tee = teeFallthrough->dynCast<LocalSet>()) {
      updateBestCast(curr, tee->index);
    }
    auto* fallthrough =
      Properties::getFallthrough(teeFallthrough, options, *getModule());
    if (auto* get = fallthrough->dynCast<LocalGet>()) {
      updateBestCast(curr, get->index);
    }
  }